

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManComputeEigenvectors(Emb_Man_t *p,int nDims,int nSols)

{
  float *pVec;
  float *pVecDest;
  float fVar1;
  bool local_35;
  int local_34;
  int local_30;
  int k;
  int j;
  int i;
  float *pVecUi;
  float *pVecUiHat;
  int nSols_local;
  int nDims_local;
  Emb_Man_t *p_local;
  
  if (nSols < nDims) {
    pVec = p->pEigen[nSols];
    for (k = 0; k < nSols; k = k + 1) {
      pVecDest = p->pEigen[k];
      Emb_ManVecRandom(pVec,nDims);
      Emb_ManVecNormal(pVec,nDims);
      local_34 = 0;
      do {
        local_34 = local_34 + 1;
        Emb_ManVecCopyOne(pVecDest,pVec,nDims);
        for (local_30 = 0; local_30 < k; local_30 = local_30 + 1) {
          Emb_ManVecOrthogonolizeOne(p->pEigen[local_30],pVecDest,nDims,pVec);
          Emb_ManVecCopyOne(pVecDest,pVec,nDims);
        }
        Emb_ManVecMultiply(p->pMatr,pVecDest,nDims,pVec);
        Emb_ManVecNormal(pVec,nDims);
        fVar1 = Emb_ManVecMultiplyOne(pVec,pVecDest,nDims);
        local_35 = fVar1 < 0.999 && local_34 < 100;
      } while (local_35);
      Emb_ManVecCopyOne(pVecDest,pVec,nDims);
    }
    return;
  }
  __assert_fail("nSols < nDims",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                ,0x552,"void Emb_ManComputeEigenvectors(Emb_Man_t *, int, int)");
}

Assistant:

void Emb_ManComputeEigenvectors( Emb_Man_t * p, int nDims, int nSols )
{
    float * pVecUiHat, * pVecUi;
    int i, j, k;
    assert( nSols < nDims );
    pVecUiHat = p->pEigen[nSols];
    for ( i = 0; i < nSols; i++ )
    {
        pVecUi = p->pEigen[i];
        Emb_ManVecRandom( pVecUiHat, nDims );
        Emb_ManVecNormal( pVecUiHat, nDims );
        k = 0;
        do {
            k++;
            Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            for ( j = 0; j < i; j++ )
            {
                Emb_ManVecOrthogonolizeOne( p->pEigen[j], pVecUi, nDims, pVecUiHat );
                Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            }
            Emb_ManVecMultiply( p->pMatr, pVecUi, nDims, pVecUiHat );
            Emb_ManVecNormal( pVecUiHat, nDims );
        } while ( Emb_ManVecMultiplyOne( pVecUiHat, pVecUi, nDims ) < 0.999 && k < 100 );
        Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
//        printf( "Converged after %d iterations.\n", k );
    }
}